

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::syntax::TokenOrSyntax>::emplaceRealloc<slang::syntax::TokenOrSyntax>
          (SmallVectorBase<slang::syntax::TokenOrSyntax> *this,pointer pos,TokenOrSyntax *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  undefined8 uVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar3 = this->cap;
  if (uVar10 < uVar3 * 2) {
    uVar10 = uVar3 * 2;
  }
  if (0x555555555555555 - uVar3 < uVar3) {
    uVar10 = 0x555555555555555;
  }
  lVar11 = (long)pos - (long)this->data_;
  pTVar8 = (pointer)operator_new(uVar10 * 0x18);
  *(undefined8 *)((long)pTVar8 + lVar11 + 0x10) =
       *(undefined8 *)
        ((long)&(args->super_ConstTokenOrSyntax).
                super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
        0x10);
  uVar5 = *(undefined8 *)
           ((long)&(args->super_ConstTokenOrSyntax).
                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .
                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
           + 8);
  *(undefined8 *)((long)pTVar8 + lVar11) =
       *(undefined8 *)
        &(args->super_ConstTokenOrSyntax).
         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
         super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>;
  ((undefined8 *)((long)pTVar8 + lVar11))[1] = uVar5;
  p = this->data_;
  sVar4 = this->len;
  lVar9 = (long)p + (sVar4 * 0x18 - (long)pos);
  pTVar6 = p;
  pTVar7 = pTVar8;
  if (lVar9 == 0) {
    if (sVar4 != 0) {
      lVar9 = 0;
      do {
        *(undefined8 *)
         ((long)&(pTVar8->super_ConstTokenOrSyntax).
                 super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
         lVar9 + 0x10) =
             *(undefined8 *)
              ((long)&(p->super_ConstTokenOrSyntax).
                      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
              + lVar9 + 0x10);
        puVar1 = (undefined8 *)
                 ((long)&(p->super_ConstTokenOrSyntax).
                         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                         .
                         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                         .
                         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                         .
                         super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                         .
                         super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                 + lVar9);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&(pTVar8->super_ConstTokenOrSyntax).
                         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                         .
                         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                         .
                         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                         .
                         super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                 + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar9 = lVar9 + 0x18;
      } while (sVar4 * 0x18 != lVar9);
    }
  }
  else {
    for (; pTVar6 != pos; pTVar6 = pTVar6 + 1) {
      *(undefined8 *)
       ((long)&(pTVar7->super_ConstTokenOrSyntax).
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
       0x10) = *(undefined8 *)
                ((long)&(pTVar6->super_ConstTokenOrSyntax).
                        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                + 0x10);
      uVar5 = *(undefined8 *)
               ((long)&(pTVar6->super_ConstTokenOrSyntax).
                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
               + 8);
      *(undefined8 *)
       &(pTVar7->super_ConstTokenOrSyntax).
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
           *(undefined8 *)
            &(pTVar6->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>;
      *(undefined8 *)
       ((long)&(pTVar7->super_ConstTokenOrSyntax).
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8)
           = uVar5;
      pTVar7 = pTVar7 + 1;
    }
    memcpy((void *)((long)pTVar8 + lVar11 + 0x18),pos,((lVar9 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar10;
  this->data_ = pTVar8;
  return (pointer)((long)pTVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}